

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCode.cpp
# Opt level: O0

void __thiscall Imf_3_3::KeyCode::setPrefix(KeyCode *this,int prefix)

{
  ArgExc *this_00;
  int in_ESI;
  long in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  if ((-1 < in_ESI) && (in_ESI < 1000000)) {
    *(int *)(in_RDI + 8) = in_ESI;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffc8);
  __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
KeyCode::setPrefix (int prefix)
{
    if (prefix < 0 || prefix > 999999)
        throw IEX_NAMESPACE::ArgExc ("Invalid key code prefix "
                                     "(must be between 0 and 999999).");

    _prefix = prefix;
}